

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON_WildCardMatch(char *s,char *pattern)

{
  bool bVar1;
  char *local_20;
  char *pattern_local;
  char *s_local;
  
  if ((pattern == (char *)0x0) || (*pattern == '\0')) {
    s_local._7_1_ = true;
    if (s != (char *)0x0) {
      s_local._7_1_ = *s == '\0';
    }
  }
  else {
    local_20 = pattern;
    pattern_local = s;
    if (*pattern == '*') {
      for (local_20 = pattern + 1; *local_20 == '*'; local_20 = local_20 + 1) {
      }
      if (*local_20 == '\0') {
        s_local._7_1_ = true;
      }
      else {
        for (; *pattern_local != '\0'; pattern_local = pattern_local + 1) {
          bVar1 = ON_WildCardMatch(pattern_local,local_20);
          if (bVar1) {
            return true;
          }
        }
        s_local._7_1_ = false;
      }
    }
    else {
      while (*local_20 != '*') {
        if (*local_20 == '?') {
          if (*pattern_local == '\0') {
            return false;
          }
          local_20 = local_20 + 1;
          pattern_local = pattern_local + 1;
        }
        else {
          if ((*local_20 == '\\') && ((local_20[1] == '*' || (local_20[1] == '?')))) {
            local_20 = local_20 + 1;
          }
          if (*local_20 != *pattern_local) {
            return false;
          }
          if (*pattern_local == '\0') {
            return true;
          }
          local_20 = local_20 + 1;
          pattern_local = pattern_local + 1;
        }
      }
      s_local._7_1_ = ON_WildCardMatch(pattern_local,local_20);
    }
  }
  return s_local._7_1_;
}

Assistant:

bool ON_WildCardMatch(const char* s, const char* pattern)
{
  if ( !pattern || !pattern[0] ) {
    return ( !s || !s[0] ) ? true : false;
  }

  if ( *pattern == '*' ) {
    pattern++;
    while ( *pattern == '*' )
      pattern++;
    
    if ( !pattern[0] )
      return true;

    while (*s) {
      if ( ON_WildCardMatch(s,pattern) )
        return true;
      s++;
    }

    return false;
  }

  while ( *pattern != '*' )
  {
    if ( *pattern == '?' ) {
      if ( *s) {
        pattern++;
        s++;
        continue;
      }
      return false;
    }
    
    if ( *pattern == '\\' ) {
      switch( pattern[1] )
      {
      case '*':
      case '?':
        pattern++;
        break;
      }
    }
    if ( *pattern != *s ) {
      return false;
    }

    if ( *s == 0 )
      return true;

    pattern++;
    s++;
  }
  
  return ON_WildCardMatch(s,pattern);
}